

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O3

int32 fe_build_melfilters(melfb_t *mel_fb)

{
  short sVar1;
  int16 *piVar2;
  mfcc_t *pmVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t size;
  long lVar8;
  int32 iVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  float fVar22;
  float32 freqs [3];
  float local_3c [3];
  double local_30;
  
  piVar2 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x231);
  mel_fb->spec_start = piVar2;
  piVar2 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x233);
  mel_fb->filt_start = piVar2;
  piVar2 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x235);
  mel_fb->filt_width = piVar2;
  fVar11 = fe_warp_unwarped_to_warped(mel_fb,(float)mel_fb->lower_filt_freq);
  dVar15 = log10((double)fVar11 / 700.0 + 1.0);
  fVar11 = (float)(dVar15 * 2595.0);
  fVar12 = fe_warp_unwarped_to_warped(mel_fb,(float)mel_fb->upper_filt_freq);
  dVar15 = log10((double)fVar12 / 700.0 + 1.0);
  iVar7 = mel_fb->num_filters;
  fVar12 = ((float)(dVar15 * 2595.0) - fVar11) / (float)(iVar7 + 1);
  if (mel_fb->doublewide == 0) {
    fVar13 = (float)mel_fb->sampling_rate;
LAB_00136021:
    fVar13 = fVar13 / (float)mel_fb->fft_size;
    iVar9 = 0;
    if (iVar7 < 1) {
      size = 0;
    }
    else {
      lVar10 = 0;
      iVar7 = 0;
      do {
        lVar8 = 0;
        do {
          dVar15 = pow(10.0,(double)((float)(((int)lVar8 << (mel_fb->doublewide != 0)) + (int)lVar10
                                            ) * fVar12 + fVar11) / 2595.0);
          fVar14 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar15 + -1.0) * 700.0));
          local_3c[lVar8] = fVar14;
          if (mel_fb->round_filters != 0) {
            local_3c[lVar8] = (float)(int)(fVar14 / fVar13 + 0.5) * fVar13;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        piVar2 = mel_fb->spec_start;
        piVar2[lVar10] = -1;
        if (-2 < mel_fb->fft_size) {
          iVar4 = mel_fb->fft_size / 2;
          iVar6 = 0;
          iVar5 = 0xffff;
          do {
            if (local_3c[0] <= (float)iVar6 * fVar13) {
              if ((iVar4 == iVar6) || (local_3c[2] < (float)iVar6 * fVar13)) {
                piVar2 = mel_fb->filt_width;
                piVar2[lVar10] = (short)iVar6 - (short)iVar5;
                mel_fb->filt_start[lVar10] = (int16)iVar7;
                iVar7 = iVar7 + piVar2[lVar10];
                break;
              }
              if ((short)iVar5 == -1) {
                piVar2[lVar10] = (short)iVar6;
                iVar5 = iVar6;
              }
            }
            iVar6 = iVar6 + 1;
          } while (iVar4 + 1 != iVar6);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < mel_fb->num_filters);
      size = (long)iVar7 << 2;
    }
    pmVar3 = (mfcc_t *)
             __ckd_malloc__(size,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                            ,0x276);
    mel_fb->filt_coeffs = pmVar3;
    if (0 < mel_fb->num_filters) {
      lVar10 = 0;
      iVar7 = 0;
      do {
        lVar8 = 0;
        do {
          dVar15 = pow(10.0,(double)((float)(((int)lVar8 << (mel_fb->doublewide != 0)) + (int)lVar10
                                            ) * fVar12 + fVar11) / 2595.0);
          fVar14 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar15 + -1.0) * 700.0));
          local_3c[lVar8] = fVar14;
          if (mel_fb->round_filters != 0) {
            local_3c[lVar8] = (float)(int)(fVar14 / fVar13 + 0.5) * fVar13;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        sVar1 = mel_fb->filt_width[lVar10];
        if (0 < sVar1) {
          iVar5 = (int)mel_fb->spec_start[lVar10];
          fVar14 = 2.0 / (local_3c[2] - local_3c[0]);
          lVar8 = (long)iVar7;
          iVar4 = 0;
          do {
            fVar17 = (float)iVar5 * fVar13;
            if ((fVar17 < local_3c[0]) || (local_3c[2] < fVar17)) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                      ,0x291,
                      "Failed to create filterbank, frequency range does not match. Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n"
                      ,(double)(float)mel_fb->sampling_rate,(double)local_3c[0],(double)fVar17,
                      (double)local_3c[2],(ulong)(uint)mel_fb->fft_size);
              exit(1);
            }
            auVar18._0_4_ = fVar17 - local_3c[0];
            auVar18._4_4_ = local_3c[2] - fVar17;
            auVar18._8_4_ = 0;
            auVar18._12_4_ = 0.0 - local_3c[2];
            auVar19._4_4_ = local_3c[2] - local_3c[1];
            auVar19._0_4_ = local_3c[1] - local_3c[0];
            auVar19._8_4_ = 0;
            auVar19._12_4_ = 0.0 - local_3c[2];
            auVar19 = divps(auVar18,auVar19);
            uVar21 = (uint)(mel_fb->unit_area == 0);
            uVar20 = (int)(uVar21 << 0x1f) >> 0x1f;
            uVar21 = (int)(uVar21 << 0x1f) >> 0x1f;
            fVar17 = (float)(~uVar20 & (uint)(fVar14 * auVar19._0_4_) | (uint)auVar19._0_4_ & uVar20
                            );
            fVar22 = (float)(~uVar21 & (uint)(fVar14 * auVar19._4_4_) | (uint)auVar19._4_4_ & uVar21
                            );
            if (fVar22 <= fVar17) {
              fVar17 = fVar22;
            }
            mel_fb->filt_coeffs[lVar8] = (mfcc_t)fVar17;
            lVar8 = lVar8 + 1;
            iVar4 = iVar4 + -1;
            iVar5 = iVar5 + 1;
          } while (-(int)sVar1 != iVar4);
          iVar7 = iVar7 - iVar4;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < mel_fb->num_filters);
      iVar9 = 0;
    }
  }
  else {
    fVar11 = fVar11 - fVar12;
    local_30 = (double)fVar11 / 2595.0;
    dVar16 = pow(10.0,local_30);
    fVar13 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar16 + -1.0) * 700.0));
    dVar15 = (double)((float)(dVar15 * 2595.0) + fVar12) / 2595.0;
    if (0.0 <= fVar13) {
      dVar16 = pow(10.0,dVar15);
      fVar14 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar16 + -1.0) * 700.0));
      fVar13 = (float)mel_fb->sampling_rate;
      if (fVar14 <= fVar13 * 0.5) {
        iVar7 = mel_fb->num_filters;
        goto LAB_00136021;
      }
    }
    dVar16 = pow(10.0,local_30);
    fVar11 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar16 + -1.0) * 700.0));
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
            ,0x245,"Out of Range: low  filter edge = %f (%f)\n",(double)fVar11,0);
    dVar15 = pow(10.0,dVar15);
    fVar11 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar15 + -1.0) * 700.0));
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
            ,0x248,"              high filter edge = %f (%f)\n",(double)fVar11,
            (double)((float)mel_fb->sampling_rate * 0.5));
    iVar9 = -10;
  }
  return iVar9;
}

Assistant:

int32
fe_build_melfilters(melfb_t * mel_fb)
{
    float32 melmin, melmax, melbw, fftfreq;
    int n_coeffs, i, j;


    /* Filter coefficient matrix, in flattened form. */
    mel_fb->spec_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->spec_start));
    mel_fb->filt_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_start));
    mel_fb->filt_width =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_width));

    /* First calculate the widths of each filter. */
    /* Minimum and maximum frequencies in mel scale. */
    melmin = fe_mel(mel_fb, mel_fb->lower_filt_freq);
    melmax = fe_mel(mel_fb, mel_fb->upper_filt_freq);

    /* Width of filters in mel scale */
    melbw = (melmax - melmin) / (mel_fb->num_filters + 1);
    if (mel_fb->doublewide) {
        melmin -= melbw;
        melmax += melbw;
        if ((fe_melinv(mel_fb, melmin) < 0) ||
            (fe_melinv(mel_fb, melmax) > mel_fb->sampling_rate / 2)) {
            E_WARN
                ("Out of Range: low  filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmin), 0.0);
            E_WARN
                ("              high filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmax), mel_fb->sampling_rate / 2);
            return FE_INVALID_PARAM_ERROR;
        }
    }

    /* DFT point spacing */
    fftfreq = mel_fb->sampling_rate / (float32) mel_fb->fft_size;

    /* Count and place filter coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        /* spec_start is the start of this filter in the power spectrum. */
        mel_fb->spec_start[i] = -1;
        /* There must be a better way... */
        for (j = 0; j < mel_fb->fft_size / 2 + 1; ++j) {
            float32 hz = j * fftfreq;
            if (hz < freqs[0])
                continue;
            else if (hz > freqs[2] || j == mel_fb->fft_size / 2) {
                /* filt_width is the width in DFT points of this filter. */
                mel_fb->filt_width[i] = j - mel_fb->spec_start[i];
                /* filt_start is the start of this filter in the filt_coeffs array. */
                mel_fb->filt_start[i] = n_coeffs;
                n_coeffs += mel_fb->filt_width[i];
                break;
            }
            if (mel_fb->spec_start[i] == -1)
                mel_fb->spec_start[i] = j;
        }
    }

    /* Now go back and allocate the coefficient array. */
    mel_fb->filt_coeffs =
        ckd_malloc(n_coeffs * sizeof(*mel_fb->filt_coeffs));

    /* And now generate the coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        for (j = 0; j < mel_fb->filt_width[i]; ++j) {
            float32 hz, loslope, hislope;

            hz = (mel_fb->spec_start[i] + j) * fftfreq;
            if (hz < freqs[0] || hz > freqs[2]) {
                E_FATAL
                    ("Failed to create filterbank, frequency range does not match. "
                     "Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n",
                     mel_fb->sampling_rate, mel_fb->fft_size, freqs[0], hz,
                     freqs[2]);
            }
            loslope = (hz - freqs[0]) / (freqs[1] - freqs[0]);
            hislope = (freqs[2] - hz) / (freqs[2] - freqs[1]);
            if (mel_fb->unit_area) {
                loslope *= 2 / (freqs[2] - freqs[0]);
                hislope *= 2 / (freqs[2] - freqs[0]);
            }
            if (loslope < hislope) {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(loslope);
#else
                mel_fb->filt_coeffs[n_coeffs] = loslope;
#endif
            }
            else {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(hislope);
#else
                mel_fb->filt_coeffs[n_coeffs] = hislope;
#endif
            }
            ++n_coeffs;
        }
    }

    return FE_SUCCESS;
}